

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O1

bool __thiscall branch_and_reduce_algorithm::fold2Reduction(branch_and_reduce_algorithm *this)

{
  int iVar1;
  pointer piVar2;
  pointer pvVar3;
  int *piVar4;
  pointer piVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  int *piVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> copyOfTmp;
  allocator_type local_65;
  int local_64;
  void *local_60 [2];
  long local_50;
  void *local_48 [2];
  long local_38;
  
  iVar1 = this->rn;
  if (0 < this->n) {
    lVar9 = 0;
    do {
      piVar2 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar2[lVar9] < 0) {
        pvVar3 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar6 = pvVar3[lVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = *(pointer *)
                  ((long)&pvVar3[lVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
        bVar10 = piVar6 != piVar4;
        if (bVar10) {
          piVar5 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar7 = 0;
          do {
            bVar11 = piVar2[*piVar6] < 0;
            iVar8 = iVar7;
            if (bVar11) {
              iVar8 = iVar7 + 1;
              piVar5[iVar7] = *piVar6;
            }
            if (bVar11 && 1 < iVar7) break;
            piVar6 = piVar6 + 1;
            bVar10 = piVar6 != piVar4;
            iVar7 = iVar8;
          } while (bVar10);
          if (!(bool)(iVar8 < 2 | bVar10)) {
            iVar7 = *(this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar6 = pvVar3[iVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar4 = *(pointer *)
                      ((long)&pvVar3[iVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data + 8);
            bVar10 = piVar6 == piVar4;
            if (!bVar10) {
              iVar7 = *piVar6;
              while (iVar7 != (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[1]) {
                piVar6 = piVar6 + 1;
                bVar10 = piVar6 == piVar4;
                if (bVar10) goto LAB_0010ce22;
                iVar7 = *piVar6;
              }
              set(this,(int)lVar9,0);
              if (!bVar10) goto LAB_0010cd51;
            }
LAB_0010ce22:
            __first._M_current =
                 (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
            std::vector<int,std::allocator<int>>::
            vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                      ((vector<int,std::allocator<int>> *)local_48,__first,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       (__first._M_current + 2),(allocator_type *)local_60);
            __l._M_len = 1;
            __l._M_array = &local_64;
            local_64 = (int)lVar9;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)local_60,__l,&local_65);
            compute_fold(this,(vector<int,_std::allocator<int>_> *)local_60,
                         (vector<int,_std::allocator<int>_> *)local_48);
            if (local_60[0] != (void *)0x0) {
              operator_delete(local_60[0],local_50 - (long)local_60[0]);
            }
            if (local_48[0] != (void *)0x0) {
              operator_delete(local_48[0],local_38 - (long)local_48[0]);
            }
          }
        }
      }
LAB_0010cd51:
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->n);
  }
  if (((2 < debug) && (this->depth <= this->maxDepth)) && (iVar1 != this->rn)) {
    fold2Reduction();
  }
  return iVar1 != this->rn;
}

Assistant:

bool branch_and_reduce_algorithm::fold2Reduction()
{
    int oldn = rn;
    std::vector<int> &tmp = level;
    for (int v = 0; v < n; v++)
        if (x[v] < 0)
        {
            int p = 0;
            for (int u : adj[v])
                if (x[u] < 0)
                {
                    tmp[p++] = u;
                    if (p > 2)
                        goto loop;
                }
            if (p < 2)
                continue;
            for (int u : adj[tmp[0]])
                if (u == tmp[1]) // triangle
                {
                    set(v, 0);
                    goto loop;
                }
            {
                std::vector<int> copyOfTmp(tmp.begin(), tmp.begin() + 2);
                compute_fold(std::vector<int>{v}, copyOfTmp);
            }
        loop:;
        }
    if (debug >= 3 && depth <= maxDepth && oldn != rn)
        fprintf(stderr, "%sfold2: %d -> %d\n", debugString().c_str(), oldn, rn);
    return oldn != rn;
}